

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode Curl_ossl_verifyhost(Curl_easy *data,connectdata *conn,ssl_peer *peer,X509 *server_cert)

{
  bool bVar1;
  _Bool _Var2;
  int iVar3;
  OPENSSL_STACK *pOVar4;
  stack_st_GENERAL_NAME *__n;
  stack_st_GENERAL_NAME *psVar5;
  X509_NAME *name_00;
  X509_NAME_ENTRY *ne;
  ASN1_STRING *x;
  uchar *__dest;
  void *__src;
  size_t uznum;
  byte local_b9;
  ASN1_STRING *tmp;
  int j;
  X509_NAME *name;
  uchar *puStack_98;
  int peerlen;
  uchar *peer_CN;
  stack_st_GENERAL_NAME *psStack_88;
  int i_1;
  size_t altlen;
  char *altptr;
  GENERAL_NAME *check;
  int local_68;
  _Bool ipmatched;
  int iStack_64;
  _Bool dnsmatched;
  int i;
  int numalts;
  size_t hostlen;
  undefined1 local_50 [2];
  _Bool iPAddress;
  _Bool dNSName;
  CURLcode result;
  in6_addr addr;
  stack_st_GENERAL_NAME *altnames;
  size_t addrlen;
  int target;
  _Bool matched;
  X509 *server_cert_local;
  ssl_peer *peer_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  bVar1 = false;
  addrlen._0_4_ = 2;
  altnames = (stack_st_GENERAL_NAME *)0x0;
  hostlen._4_4_ = CURLE_OK;
  hostlen._3_1_ = 0;
  hostlen._2_1_ = 0;
  _i = strlen(peer->hostname);
  if ((peer->field_0x18 & 1) != 0) {
    if ((((uint)conn->bits >> 0xb & 1) == 0) ||
       (iVar3 = inet_pton(10,peer->hostname,local_50), iVar3 == 0)) {
      iVar3 = inet_pton(2,peer->hostname,local_50);
      if (iVar3 != 0) {
        addrlen._0_4_ = 7;
        altnames = (stack_st_GENERAL_NAME *)0x4;
      }
    }
    else {
      addrlen._0_4_ = 7;
      altnames = (stack_st_GENERAL_NAME *)0x10;
    }
  }
  addr.__in6_u._8_8_ = X509_get_ext_d2i((X509 *)server_cert,0x55,(int *)0x0,(int *)0x0);
  if ((stack_st_GENERAL_NAME *)addr.__in6_u._8_8_ != (stack_st_GENERAL_NAME *)0x0) {
    check._7_1_ = 0;
    check._6_1_ = 0;
    pOVar4 = ossl_check_const_GENERAL_NAME_sk_type((stack_st_GENERAL_NAME *)addr.__in6_u._8_8_);
    iStack_64 = OPENSSL_sk_num(pOVar4);
    local_68 = 0;
    while( true ) {
      local_b9 = 0;
      if (local_68 < iStack_64) {
        local_b9 = check._7_1_ ^ 0xff;
      }
      if ((local_b9 & 1) == 0) break;
      pOVar4 = ossl_check_const_GENERAL_NAME_sk_type((stack_st_GENERAL_NAME *)addr.__in6_u._8_8_);
      altptr = (char *)OPENSSL_sk_value(pOVar4,local_68);
      if (*(int *)altptr == 2) {
        hostlen._3_1_ = 1;
      }
      else if (*(int *)altptr == 7) {
        hostlen._2_1_ = 1;
      }
      if (*(int *)altptr == (int)addrlen) {
        altlen = ASN1_STRING_get0_data(*(undefined8 *)((long)altptr + 8));
        iVar3 = ASN1_STRING_length(*(ASN1_STRING **)(altptr + 8));
        __n = (stack_st_GENERAL_NAME *)(long)iVar3;
        psStack_88 = __n;
        if ((int)addrlen == 2) {
          psVar5 = (stack_st_GENERAL_NAME *)strlen((char *)altlen);
          if ((__n == psVar5) &&
             (_Var2 = subj_alt_hostcheck(data,(char *)altlen,(size_t)psStack_88,peer->hostname,_i,
                                         peer->dispname), _Var2)) {
            check._7_1_ = 1;
          }
        }
        else if (((((int)addrlen == 7) && (__n == altnames)) &&
                 (iVar3 = memcmp((void *)altlen,local_50,(size_t)__n), iVar3 == 0)) &&
                ((check._6_1_ = 1, data != (Curl_easy *)0x0 &&
                 ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)))) {
          Curl_infof(data," subjectAltName: host \"%s\" matched cert\'s IP address!",peer->dispname)
          ;
        }
      }
      local_68 = local_68 + 1;
    }
    GENERAL_NAMES_free((GENERAL_NAMES *)addr.__in6_u._8_8_);
    if (((check._7_1_ & 1) != 0) || ((check._6_1_ & 1) != 0)) {
      bVar1 = true;
    }
  }
  if (!bVar1) {
    if (((hostlen._3_1_ & 1) == 0) && ((hostlen._2_1_ & 1) == 0)) {
      peer_CN._4_4_ = -1;
      puStack_98 = (uchar *)0x0;
      name._4_4_ = 0;
      name_00 = X509_get_subject_name((X509 *)server_cert);
      iVar3 = peer_CN._4_4_;
      if (name_00 != (X509_NAME *)0x0) {
        do {
          peer_CN._4_4_ = iVar3;
          iVar3 = X509_NAME_get_index_by_NID(name_00,0xd,peer_CN._4_4_);
        } while (-1 < iVar3);
      }
      if (-1 < peer_CN._4_4_) {
        ne = X509_NAME_get_entry(name_00,peer_CN._4_4_);
        x = X509_NAME_ENTRY_get_data(ne);
        if (x != (ASN1_STRING *)0x0) {
          iVar3 = ASN1_STRING_type(x);
          if (iVar3 == 0xc) {
            name._4_4_ = ASN1_STRING_length(x);
            if (-1 < name._4_4_) {
              __dest = (uchar *)CRYPTO_malloc(name._4_4_ + 1,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcurl/lib/vtls/openssl.c"
                                              ,0x8f1);
              puStack_98 = __dest;
              if (__dest == (uchar *)0x0) {
                hostlen._4_4_ = CURLE_OUT_OF_MEMORY;
              }
              else {
                __src = (void *)ASN1_STRING_get0_data(x);
                memcpy(__dest,__src,(long)name._4_4_);
                puStack_98[name._4_4_] = '\0';
              }
            }
          }
          else {
            name._4_4_ = ASN1_STRING_to_UTF8(&stack0xffffffffffffff68,x);
          }
          if (puStack_98 != (uchar *)0x0) {
            uznum = strlen((char *)puStack_98);
            iVar3 = curlx_uztosi(uznum);
            if (iVar3 != name._4_4_) {
              Curl_failf(data,"SSL: illegal cert name field");
              hostlen._4_4_ = CURLE_PEER_FAILED_VERIFICATION;
            }
          }
        }
      }
      if (hostlen._4_4_ == CURLE_OK) {
        if (puStack_98 == (uchar *)0x0) {
          Curl_failf(data,"SSL: unable to obtain common name from peer certificate");
          hostlen._4_4_ = CURLE_PEER_FAILED_VERIFICATION;
        }
        else {
          _Var2 = Curl_cert_hostcheck((char *)puStack_98,(long)name._4_4_,peer->hostname,_i);
          if (_Var2) {
            if ((data != (Curl_easy *)0x0) &&
               ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) {
              Curl_infof(data," common name: %s (matched)",puStack_98);
            }
          }
          else {
            Curl_failf(data,
                       "SSL: certificate subject name \'%s\' does not match target host name \'%s\'"
                       ,puStack_98,peer->dispname);
            hostlen._4_4_ = CURLE_PEER_FAILED_VERIFICATION;
          }
        }
      }
      if (puStack_98 != (uchar *)0x0) {
        CRYPTO_free(puStack_98);
      }
    }
    else {
      if ((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) {
        Curl_infof(data," subjectAltName does not match %s",peer->dispname);
      }
      Curl_failf(data,"SSL: no alternative certificate subject name matches target host name \'%s\'"
                 ,peer->dispname);
      hostlen._4_4_ = CURLE_PEER_FAILED_VERIFICATION;
    }
  }
  return hostlen._4_4_;
}

Assistant:

CURLcode Curl_ossl_verifyhost(struct Curl_easy *data, struct connectdata *conn,
                              struct ssl_peer *peer, X509 *server_cert)
{
  bool matched = FALSE;
  int target = GEN_DNS; /* target type, GEN_DNS or GEN_IPADD */
  size_t addrlen = 0;
  STACK_OF(GENERAL_NAME) *altnames;
#ifdef ENABLE_IPV6
  struct in6_addr addr;
#else
  struct in_addr addr;
#endif
  CURLcode result = CURLE_OK;
  bool dNSName = FALSE; /* if a dNSName field exists in the cert */
  bool iPAddress = FALSE; /* if a iPAddress field exists in the cert */
  size_t hostlen;

  (void)conn;
  hostlen = strlen(peer->hostname);
  if(peer->is_ip_address) {
#ifdef ENABLE_IPV6
    if(conn->bits.ipv6_ip &&
       Curl_inet_pton(AF_INET6, peer->hostname, &addr)) {
      target = GEN_IPADD;
      addrlen = sizeof(struct in6_addr);
    }
    else
#endif
      if(Curl_inet_pton(AF_INET, peer->hostname, &addr)) {
        target = GEN_IPADD;
        addrlen = sizeof(struct in_addr);
      }
  }

  /* get a "list" of alternative names */
  altnames = X509_get_ext_d2i(server_cert, NID_subject_alt_name, NULL, NULL);

  if(altnames) {
#if defined(OPENSSL_IS_BORINGSSL) || defined(OPENSSL_IS_AWSLC)
    size_t numalts;
    size_t i;
#else
    int numalts;
    int i;
#endif
    bool dnsmatched = FALSE;
    bool ipmatched = FALSE;

    /* get amount of alternatives, RFC2459 claims there MUST be at least
       one, but we don't depend on it... */
    numalts = sk_GENERAL_NAME_num(altnames);

    /* loop through all alternatives - until a dnsmatch */
    for(i = 0; (i < numalts) && !dnsmatched; i++) {
      /* get a handle to alternative name number i */
      const GENERAL_NAME *check = sk_GENERAL_NAME_value(altnames, i);

      if(check->type == GEN_DNS)
        dNSName = TRUE;
      else if(check->type == GEN_IPADD)
        iPAddress = TRUE;

      /* only check alternatives of the same type the target is */
      if(check->type == target) {
        /* get data and length */
        const char *altptr = (char *)ASN1_STRING_get0_data(check->d.ia5);
        size_t altlen = (size_t) ASN1_STRING_length(check->d.ia5);

        switch(target) {
        case GEN_DNS: /* name/pattern comparison */
          /* The OpenSSL man page explicitly says: "In general it cannot be
             assumed that the data returned by ASN1_STRING_data() is null
             terminated or does not contain embedded nulls." But also that
             "The actual format of the data will depend on the actual string
             type itself: for example for an IA5String the data will be ASCII"

             It has been however verified that in 0.9.6 and 0.9.7, IA5String
             is always null-terminated.
          */
          if((altlen == strlen(altptr)) &&
             /* if this isn't true, there was an embedded zero in the name
                string and we cannot match it. */
             subj_alt_hostcheck(data, altptr, altlen,
                                peer->hostname, hostlen,
                                peer->dispname)) {
            dnsmatched = TRUE;
          }
          break;

        case GEN_IPADD: /* IP address comparison */
          /* compare alternative IP address if the data chunk is the same size
             our server IP address is */
          if((altlen == addrlen) && !memcmp(altptr, &addr, altlen)) {
            ipmatched = TRUE;
            infof(data,
                  " subjectAltName: host \"%s\" matched cert's IP address!",
                  peer->dispname);
          }
          break;
        }
      }
    }
    GENERAL_NAMES_free(altnames);

    if(dnsmatched || ipmatched)
      matched = TRUE;
  }

  if(matched)
    /* an alternative name matched */
    ;
  else if(dNSName || iPAddress) {
    infof(data, " subjectAltName does not match %s", peer->dispname);
    failf(data, "SSL: no alternative certificate subject name matches "
          "target host name '%s'", peer->dispname);
    result = CURLE_PEER_FAILED_VERIFICATION;
  }
  else {
    /* we have to look to the last occurrence of a commonName in the
       distinguished one to get the most significant one. */
    int i = -1;
    unsigned char *peer_CN = NULL;
    int peerlen = 0;

    /* The following is done because of a bug in 0.9.6b */
    X509_NAME *name = X509_get_subject_name(server_cert);
    if(name) {
      int j;
      while((j = X509_NAME_get_index_by_NID(name, NID_commonName, i)) >= 0)
        i = j;
    }

    /* we have the name entry and we will now convert this to a string
       that we can use for comparison. Doing this we support BMPstring,
       UTF8, etc. */

    if(i >= 0) {
      ASN1_STRING *tmp =
        X509_NAME_ENTRY_get_data(X509_NAME_get_entry(name, i));

      /* In OpenSSL 0.9.7d and earlier, ASN1_STRING_to_UTF8 fails if the input
         is already UTF-8 encoded. We check for this case and copy the raw
         string manually to avoid the problem. This code can be made
         conditional in the future when OpenSSL has been fixed. */
      if(tmp) {
        if(ASN1_STRING_type(tmp) == V_ASN1_UTF8STRING) {
          peerlen = ASN1_STRING_length(tmp);
          if(peerlen >= 0) {
            peer_CN = OPENSSL_malloc(peerlen + 1);
            if(peer_CN) {
              memcpy(peer_CN, ASN1_STRING_get0_data(tmp), peerlen);
              peer_CN[peerlen] = '\0';
            }
            else
              result = CURLE_OUT_OF_MEMORY;
          }
        }
        else /* not a UTF8 name */
          peerlen = ASN1_STRING_to_UTF8(&peer_CN, tmp);

        if(peer_CN && (curlx_uztosi(strlen((char *)peer_CN)) != peerlen)) {
          /* there was a terminating zero before the end of string, this
             cannot match and we return failure! */
          failf(data, "SSL: illegal cert name field");
          result = CURLE_PEER_FAILED_VERIFICATION;
        }
      }
    }

    if(result)
      /* error already detected, pass through */
      ;
    else if(!peer_CN) {
      failf(data,
            "SSL: unable to obtain common name from peer certificate");
      result = CURLE_PEER_FAILED_VERIFICATION;
    }
    else if(!Curl_cert_hostcheck((const char *)peer_CN,
                                 peerlen, peer->hostname, hostlen)) {
      failf(data, "SSL: certificate subject name '%s' does not match "
            "target host name '%s'", peer_CN, peer->dispname);
      result = CURLE_PEER_FAILED_VERIFICATION;
    }
    else {
      infof(data, " common name: %s (matched)", peer_CN);
    }
    if(peer_CN)
      OPENSSL_free(peer_CN);
  }

  return result;
}